

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_channel_converter_init_preallocated
                    (ma_channel_converter_config *pConfig,void *pHeap,
                    ma_channel_converter *pConverter)

{
  float fVar1;
  byte bVar2;
  byte bVar3;
  ma_channel mVar4;
  ma_channel channelPosition;
  ma_result mVar5;
  ma_channel_conversion_path mVar6;
  ma_int32 mVar7;
  ma_bool32 mVar8;
  ma_uint32 mVar9;
  int *in_RDX;
  long in_RSI;
  int *in_RDI;
  ma_channel channelPosIn_3;
  float weightForLFE;
  ma_uint32 iChannelOutLFE;
  ma_uint32 spatialChannelCount;
  float weight_3;
  ma_channel channelPosIn_2;
  ma_channel channelPosOut_2;
  float weight_2;
  ma_channel channelPosOut_1;
  ma_channel channelPosIn_1;
  float weight_1;
  float weight;
  ma_channel channelPosOut;
  ma_channel channelPosIn;
  ma_uint32 iChannelOut;
  ma_uint32 iChannelIn;
  ma_channel_converter_heap_layout heapLayout;
  ma_result result;
  undefined4 in_stack_ffffffffffffff58;
  int iVar10;
  ma_uint32 in_stack_ffffffffffffff5c;
  undefined4 in_stack_ffffffffffffff60;
  ma_uint32 in_stack_ffffffffffffff64;
  undefined4 in_stack_ffffffffffffff68;
  float in_stack_ffffffffffffff6c;
  undefined2 in_stack_ffffffffffffff70;
  ma_channel in_stack_ffffffffffffff72;
  ma_channel in_stack_ffffffffffffff73;
  undefined4 in_stack_ffffffffffffff74;
  float fVar11;
  undefined2 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7a;
  undefined1 in_stack_ffffffffffffff7b;
  undefined4 in_stack_ffffffffffffff7c;
  ma_uint32 in_stack_ffffffffffffff84;
  undefined4 in_stack_ffffffffffffff88;
  uint uVar12;
  undefined4 in_stack_ffffffffffffff8c;
  uint uVar13;
  undefined4 local_70;
  ma_uint32 in_stack_ffffffffffffff94;
  ma_channel *in_stack_ffffffffffffff98;
  long local_60;
  long local_58;
  long local_50;
  
  if (in_RDX == (int *)0x0) {
    return MA_INVALID_ARGS;
  }
  if (in_RDX != (int *)0x0) {
    memset(in_RDX,0,0x48);
  }
  mVar5 = ma_channel_converter_get_heap_layout
                    ((ma_channel_converter_config *)
                     CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                     (ma_channel_converter_heap_layout *)
                     CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
  if (mVar5 != MA_SUCCESS) {
    return mVar5;
  }
  *(long *)(in_RDX + 0xe) = in_RSI;
  if ((*(void **)(in_RDX + 0xe) != (void *)0x0) &&
     (CONCAT44(in_stack_ffffffffffffff94,local_70) != 0)) {
    memset(*(void **)(in_RDX + 0xe),0,CONCAT44(in_stack_ffffffffffffff94,local_70));
  }
  *in_RDX = *in_RDI;
  in_RDX[1] = in_RDI[1];
  in_RDX[2] = in_RDI[2];
  in_RDX[3] = in_RDI[8];
  if (*(long *)(in_RDI + 4) == 0) {
    in_RDX[6] = 0;
    in_RDX[7] = 0;
  }
  else {
    *(ma_channel **)(in_RDX + 6) = in_stack_ffffffffffffff98 + in_RSI;
    ma_channel_map_copy_or_default
              ((ma_channel *)
               CONCAT44(in_stack_ffffffffffffff74,
                        CONCAT13(in_stack_ffffffffffffff73,
                                 CONCAT12(in_stack_ffffffffffffff72,in_stack_ffffffffffffff70))),
               CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
               (ma_channel *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
               in_stack_ffffffffffffff5c);
  }
  if (*(long *)(in_RDI + 6) == 0) {
    in_RDX[8] = 0;
    in_RDX[9] = 0;
  }
  else {
    *(long *)(in_RDX + 8) = in_RSI + local_60;
    ma_channel_map_copy_or_default
              ((ma_channel *)
               CONCAT44(in_stack_ffffffffffffff74,
                        CONCAT13(in_stack_ffffffffffffff73,
                                 CONCAT12(in_stack_ffffffffffffff72,in_stack_ffffffffffffff70))),
               CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
               (ma_channel *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
               in_stack_ffffffffffffff5c);
  }
  mVar6 = ma_channel_converter_config_get_conversion_path((ma_channel_converter_config *)0x228fd1);
  in_RDX[4] = mVar6;
  if (in_RDX[4] == 4) {
    *(long *)(in_RDX + 10) = in_RSI + local_58;
    ma_channel_map_build_shuffle_table
              (in_stack_ffffffffffffff98,in_stack_ffffffffffffff94,
               (ma_channel *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
               in_stack_ffffffffffffff84,
               (ma_uint8 *)
               CONCAT44(in_stack_ffffffffffffff7c,
                        CONCAT13(in_stack_ffffffffffffff7b,
                                 CONCAT12(in_stack_ffffffffffffff7a,in_stack_ffffffffffffff78))));
  }
  if (in_RDX[4] != 5) {
    return MA_SUCCESS;
  }
  if (*in_RDX == 5) {
    *(long *)(in_RDX + 0xc) = in_RSI + local_50;
    for (uVar13 = 0; uVar13 < (uint)in_RDX[1]; uVar13 = uVar13 + 1) {
      *(ulong *)(*(long *)(in_RDX + 0xc) + (ulong)uVar13 * 8) =
           in_RSI + local_50 +
                    (ulong)(uint)in_RDX[1] * 8 + (ulong)(uint)in_RDX[2] * 4 * (ulong)uVar13;
    }
  }
  else {
    *(long *)(in_RDX + 0xc) = in_RSI + local_50;
    for (uVar13 = 0; uVar13 < (uint)in_RDX[1]; uVar13 = uVar13 + 1) {
      *(ulong *)(*(long *)(in_RDX + 0xc) + (ulong)uVar13 * 8) =
           in_RSI + local_50 +
                    (ulong)(uint)in_RDX[1] * 8 + (ulong)(uint)in_RDX[2] * 4 * (ulong)uVar13;
    }
  }
  for (uVar13 = 0; uVar13 < (uint)in_RDX[1]; uVar13 = uVar13 + 1) {
    for (uVar12 = 0; uVar12 < (uint)in_RDX[2]; uVar12 = uVar12 + 1) {
      if (*in_RDX == 5) {
        *(undefined4 *)(*(long *)(*(long *)(in_RDX + 0xc) + (ulong)uVar13 * 8) + (ulong)uVar12 * 4)
             = 0;
      }
      else {
        *(undefined4 *)(*(long *)(*(long *)(in_RDX + 0xc) + (ulong)uVar13 * 8) + (ulong)uVar12 * 4)
             = 0;
      }
    }
  }
  for (uVar13 = 0; uVar13 < (uint)in_RDX[1]; uVar13 = uVar13 + 1) {
    bVar2 = ma_channel_map_get_channel
                      ((ma_channel *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),0
                       ,0x229200);
    iVar10 = (uint)bVar2 << 0x18;
    for (uVar12 = 0; bVar2 = (byte)((uint)iVar10 >> 0x18), uVar12 < (uint)in_RDX[2];
        uVar12 = uVar12 + 1) {
      bVar3 = ma_channel_map_get_channel
                        ((ma_channel *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58)
                         ,0,0x229238);
      iVar10 = (uint)bVar2 << 0x18;
      if (bVar2 == bVar3) {
        if (*in_RDX == 5) {
          *(undefined4 *)
           (*(long *)(*(long *)(in_RDX + 0xc) + (ulong)uVar13 * 8) + (ulong)uVar12 * 4) = 0x3f800000
          ;
        }
        else {
          mVar7 = ma_channel_converter_float_to_fixed(1.0);
          *(ma_int32 *)(*(long *)(*(long *)(in_RDX + 0xc) + (ulong)uVar13 * 8) + (ulong)uVar12 * 4)
               = mVar7;
        }
      }
    }
  }
  iVar10 = in_RDX[3];
  if (iVar10 != 0) {
    if (iVar10 == 1) {
      return MA_SUCCESS;
    }
    if (iVar10 == 2) {
      if (*(long *)(in_RDI + 10) != 0) {
        for (uVar13 = 0; uVar13 < (uint)in_RDX[1]; uVar13 = uVar13 + 1) {
          for (uVar12 = 0; uVar12 < (uint)in_RDX[2]; uVar12 = uVar12 + 1) {
            fVar11 = *(float *)(*(long *)(*(long *)(in_RDI + 10) + (ulong)uVar13 * 8) +
                               (ulong)uVar12 * 4);
            if (*in_RDX == 5) {
              *(float *)(*(long *)(*(long *)(in_RDX + 0xc) + (ulong)uVar13 * 8) + (ulong)uVar12 * 4)
                   = fVar11;
            }
            else {
              mVar7 = ma_channel_converter_float_to_fixed(fVar11);
              *(ma_int32 *)
               (*(long *)(*(long *)(in_RDX + 0xc) + (ulong)uVar13 * 8) + (ulong)uVar12 * 4) = mVar7;
            }
          }
        }
        return MA_SUCCESS;
      }
      return MA_INVALID_ARGS;
    }
  }
  for (uVar13 = 0; uVar13 < (uint)in_RDX[1]; uVar13 = uVar13 + 1) {
    mVar4 = ma_channel_map_get_channel
                      ((ma_channel *)CONCAT44(in_stack_ffffffffffffff5c,iVar10),0,0x229425);
    mVar8 = ma_is_spatial_channel_position(mVar4);
    if ((mVar8 != 0) &&
       (mVar8 = ma_channel_map_contains_channel_position
                          (in_stack_ffffffffffffff64,
                           (ma_channel *)CONCAT44(in_stack_ffffffffffffff5c,iVar10),'\0'),
       mVar8 == 0)) {
      for (uVar12 = 0; uVar12 < (uint)in_RDX[2]; uVar12 = uVar12 + 1) {
        channelPosition =
             ma_channel_map_get_channel
                       ((ma_channel *)CONCAT44(in_stack_ffffffffffffff5c,iVar10),0,0x229494);
        mVar8 = ma_is_spatial_channel_position(channelPosition);
        if (mVar8 != 0) {
          fVar11 = 0.0;
          if (in_RDX[3] == 0) {
            fVar11 = ma_calculate_channel_position_rectangular_weight(mVar4,channelPosition);
          }
          if (*in_RDX == 5) {
            fVar1 = *(float *)(*(long *)(*(long *)(in_RDX + 0xc) + (ulong)uVar13 * 8) +
                              (ulong)uVar12 * 4);
            if ((fVar1 == 0.0) && (!NAN(fVar1))) {
              *(float *)(*(long *)(*(long *)(in_RDX + 0xc) + (ulong)uVar13 * 8) + (ulong)uVar12 * 4)
                   = fVar11;
            }
          }
          else if (*(int *)(*(long *)(*(long *)(in_RDX + 0xc) + (ulong)uVar13 * 8) +
                           (ulong)uVar12 * 4) == 0) {
            mVar7 = ma_channel_converter_float_to_fixed(fVar11);
            *(ma_int32 *)
             (*(long *)(*(long *)(in_RDX + 0xc) + (ulong)uVar13 * 8) + (ulong)uVar12 * 4) = mVar7;
          }
        }
      }
    }
  }
  for (uVar13 = 0; uVar13 < (uint)in_RDX[2]; uVar13 = uVar13 + 1) {
    in_stack_ffffffffffffff73 =
         ma_channel_map_get_channel
                   ((ma_channel *)CONCAT44(in_stack_ffffffffffffff5c,iVar10),0,0x2295c6);
    mVar8 = ma_is_spatial_channel_position(in_stack_ffffffffffffff73);
    if ((mVar8 != 0) &&
       (mVar8 = ma_channel_map_contains_channel_position
                          (in_stack_ffffffffffffff64,
                           (ma_channel *)CONCAT44(in_stack_ffffffffffffff5c,iVar10),'\0'),
       mVar8 == 0)) {
      for (uVar12 = 0; uVar12 < (uint)in_RDX[1]; uVar12 = uVar12 + 1) {
        in_stack_ffffffffffffff72 =
             ma_channel_map_get_channel
                       ((ma_channel *)CONCAT44(in_stack_ffffffffffffff5c,iVar10),0,0x229635);
        mVar8 = ma_is_spatial_channel_position(in_stack_ffffffffffffff72);
        if (mVar8 != 0) {
          in_stack_ffffffffffffff6c = 0.0;
          if (in_RDX[3] == 0) {
            in_stack_ffffffffffffff6c =
                 ma_calculate_channel_position_rectangular_weight
                           (in_stack_ffffffffffffff72,in_stack_ffffffffffffff73);
          }
          if (*in_RDX == 5) {
            fVar11 = *(float *)(*(long *)(*(long *)(in_RDX + 0xc) + (ulong)uVar12 * 8) +
                               (ulong)uVar13 * 4);
            if ((fVar11 == 0.0) && (!NAN(fVar11))) {
              *(float *)(*(long *)(*(long *)(in_RDX + 0xc) + (ulong)uVar12 * 8) + (ulong)uVar13 * 4)
                   = in_stack_ffffffffffffff6c;
            }
          }
          else if (*(int *)(*(long *)(*(long *)(in_RDX + 0xc) + (ulong)uVar12 * 8) +
                           (ulong)uVar13 * 4) == 0) {
            mVar7 = ma_channel_converter_float_to_fixed(in_stack_ffffffffffffff6c);
            *(ma_int32 *)
             (*(long *)(*(long *)(in_RDX + 0xc) + (ulong)uVar12 * 8) + (ulong)uVar13 * 4) = mVar7;
          }
        }
      }
    }
  }
  if ((((in_RDI[9] != 0) &&
       (mVar8 = ma_channel_map_contains_channel_position
                          (in_stack_ffffffffffffff64,
                           (ma_channel *)CONCAT44(in_stack_ffffffffffffff5c,iVar10),'\0'),
       mVar8 == 0)) &&
      (mVar9 = ma_channel_map_get_spatial_channel_count
                         ((ma_channel *)
                          CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                          in_stack_ffffffffffffff5c), mVar9 != 0)) &&
     (mVar8 = ma_channel_map_find_channel_position
                        (CONCAT13(in_stack_ffffffffffffff73,
                                  CONCAT12(in_stack_ffffffffffffff72,in_stack_ffffffffffffff70)),
                         (ma_channel *)CONCAT44(in_stack_ffffffffffffff6c,mVar9),
                         (ma_channel)(in_stack_ffffffffffffff64 >> 0x18),
                         (ma_uint32 *)CONCAT44(in_stack_ffffffffffffff5c,iVar10)), mVar8 != 0)) {
    fVar11 = 1.0 / (float)mVar9;
    for (uVar13 = 0; uVar13 < (uint)in_RDX[1]; uVar13 = uVar13 + 1) {
      mVar4 = ma_channel_map_get_channel
                        ((ma_channel *)CONCAT44(in_stack_ffffffffffffff5c,iVar10),0,0x229803);
      in_stack_ffffffffffffff5c = CONCAT13(mVar4,(int3)in_stack_ffffffffffffff5c);
      mVar8 = ma_is_spatial_channel_position(mVar4);
      if (mVar8 != 0) {
        if (*in_RDX == 5) {
          fVar1 = *(float *)(*(long *)(*(long *)(in_RDX + 0xc) + (ulong)uVar13 * 8) +
                            (ulong)in_stack_ffffffffffffff64 * 4);
          if ((fVar1 == 0.0) && (!NAN(fVar1))) {
            *(float *)(*(long *)(*(long *)(in_RDX + 0xc) + (ulong)uVar13 * 8) +
                      (ulong)in_stack_ffffffffffffff64 * 4) = fVar11;
          }
        }
        else if (*(int *)(*(long *)(*(long *)(in_RDX + 0xc) + (ulong)uVar13 * 8) +
                         (ulong)in_stack_ffffffffffffff64 * 4) == 0) {
          mVar7 = ma_channel_converter_float_to_fixed(fVar11);
          *(ma_int32 *)
           (*(long *)(*(long *)(in_RDX + 0xc) + (ulong)uVar13 * 8) +
           (ulong)in_stack_ffffffffffffff64 * 4) = mVar7;
        }
      }
    }
  }
  return MA_SUCCESS;
}

Assistant:

MA_API ma_result ma_channel_converter_init_preallocated(const ma_channel_converter_config* pConfig, void* pHeap, ma_channel_converter* pConverter)
{
    ma_result result;
    ma_channel_converter_heap_layout heapLayout;

    if (pConverter == NULL) {
        return MA_INVALID_ARGS;
    }

    MA_ZERO_OBJECT(pConverter);

    result = ma_channel_converter_get_heap_layout(pConfig, &heapLayout);
    if (result != MA_SUCCESS) {
        return result;
    }

    pConverter->_pHeap = pHeap;
    MA_ZERO_MEMORY(pConverter->_pHeap, heapLayout.sizeInBytes);

    pConverter->format      = pConfig->format;
    pConverter->channelsIn  = pConfig->channelsIn;
    pConverter->channelsOut = pConfig->channelsOut;
    pConverter->mixingMode  = pConfig->mixingMode;

    if (pConfig->pChannelMapIn != NULL) {
        pConverter->pChannelMapIn = (ma_channel*)ma_offset_ptr(pHeap, heapLayout.channelMapInOffset);
        ma_channel_map_copy_or_default(pConverter->pChannelMapIn, pConfig->channelsIn, pConfig->pChannelMapIn, pConfig->channelsIn);
    } else {
        pConverter->pChannelMapIn = NULL;   /* Use default channel map. */
    }

    if (pConfig->pChannelMapOut != NULL) {
        pConverter->pChannelMapOut = (ma_channel*)ma_offset_ptr(pHeap, heapLayout.channelMapOutOffset);
        ma_channel_map_copy_or_default(pConverter->pChannelMapOut, pConfig->channelsOut, pConfig->pChannelMapOut, pConfig->channelsOut);
    } else {
        pConverter->pChannelMapOut = NULL;  /* Use default channel map. */
    }

    pConverter->conversionPath = ma_channel_converter_config_get_conversion_path(pConfig);

    if (pConverter->conversionPath == ma_channel_conversion_path_shuffle) {
        pConverter->pShuffleTable = (ma_uint8*)ma_offset_ptr(pHeap, heapLayout.shuffleTableOffset);
        ma_channel_map_build_shuffle_table(pConverter->pChannelMapIn, pConverter->channelsIn, pConverter->pChannelMapOut, pConverter->channelsOut, pConverter->pShuffleTable);
    }

    if (pConverter->conversionPath == ma_channel_conversion_path_weights) {
        ma_uint32 iChannelIn;
        ma_uint32 iChannelOut;

        if (pConverter->format == ma_format_f32) {
            pConverter->weights.f32 = (float**   )ma_offset_ptr(pHeap, heapLayout.weightsOffset);
            for (iChannelIn = 0; iChannelIn < pConverter->channelsIn; iChannelIn += 1) {
                pConverter->weights.f32[iChannelIn] = (float*)ma_offset_ptr(pHeap, heapLayout.weightsOffset + ((sizeof(float*) * pConverter->channelsIn) + (sizeof(float) * pConverter->channelsOut * iChannelIn)));
            }
        } else {
            pConverter->weights.s16 = (ma_int32**)ma_offset_ptr(pHeap, heapLayout.weightsOffset);
            for (iChannelIn = 0; iChannelIn < pConverter->channelsIn; iChannelIn += 1) {
                pConverter->weights.s16[iChannelIn] = (ma_int32*)ma_offset_ptr(pHeap, heapLayout.weightsOffset + ((sizeof(ma_int32*) * pConverter->channelsIn) + (sizeof(ma_int32) * pConverter->channelsOut * iChannelIn)));
            }
        }

        /* Silence our weights by default. */
        for (iChannelIn = 0; iChannelIn < pConverter->channelsIn; iChannelIn += 1) {
            for (iChannelOut = 0; iChannelOut < pConverter->channelsOut; iChannelOut += 1) {
                if (pConverter->format == ma_format_f32) {
                    pConverter->weights.f32[iChannelIn][iChannelOut] = 0.0f;
                } else {
                    pConverter->weights.s16[iChannelIn][iChannelOut] = 0;
                }
            }
        }

        /*
        We now need to fill out our weights table. This is determined by the mixing mode.
        */

        /* In all cases we need to make sure all channels that are present in both channel maps have a 1:1 mapping. */
        for (iChannelIn = 0; iChannelIn < pConverter->channelsIn; ++iChannelIn) {
            ma_channel channelPosIn = ma_channel_map_get_channel(pConverter->pChannelMapIn, pConverter->channelsIn, iChannelIn);

            for (iChannelOut = 0; iChannelOut < pConverter->channelsOut; ++iChannelOut) {
                ma_channel channelPosOut = ma_channel_map_get_channel(pConverter->pChannelMapOut, pConverter->channelsOut, iChannelOut);

                if (channelPosIn == channelPosOut) {
                    float weight = 1;

                    if (pConverter->format == ma_format_f32) {
                        pConverter->weights.f32[iChannelIn][iChannelOut] = weight;
                    } else {
                        pConverter->weights.s16[iChannelIn][iChannelOut] = ma_channel_converter_float_to_fixed(weight);
                    }
                }
            }
        }

        switch (pConverter->mixingMode)
        {
            case ma_channel_mix_mode_custom_weights:
            {
                if (pConfig->ppWeights == NULL) {
                    return MA_INVALID_ARGS; /* Config specified a custom weights mixing mode, but no custom weights have been specified. */
                }

                for (iChannelIn = 0; iChannelIn < pConverter->channelsIn; iChannelIn += 1) {
                    for (iChannelOut = 0; iChannelOut < pConverter->channelsOut; iChannelOut += 1) {
                        float weight = pConfig->ppWeights[iChannelIn][iChannelOut];

                        if (pConverter->format == ma_format_f32) {
                            pConverter->weights.f32[iChannelIn][iChannelOut] = weight;
                        } else {
                            pConverter->weights.s16[iChannelIn][iChannelOut] = ma_channel_converter_float_to_fixed(weight);
                        }
                    }
                }
            } break;

            case ma_channel_mix_mode_simple:
            {
                /*
                In simple mode, only set weights for channels that have exactly matching types, leave the rest at
                zero. The 1:1 mappings have already been covered before this switch statement.
                */
            } break;

            case ma_channel_mix_mode_rectangular:
            default:
            {
                /* Unmapped input channels. */
                for (iChannelIn = 0; iChannelIn < pConverter->channelsIn; ++iChannelIn) {
                    ma_channel channelPosIn = ma_channel_map_get_channel(pConverter->pChannelMapIn, pConverter->channelsIn, iChannelIn);

                    if (ma_is_spatial_channel_position(channelPosIn)) {
                        if (!ma_channel_map_contains_channel_position(pConverter->channelsOut, pConverter->pChannelMapOut, channelPosIn)) {
                            for (iChannelOut = 0; iChannelOut < pConverter->channelsOut; ++iChannelOut) {
                                ma_channel channelPosOut = ma_channel_map_get_channel(pConverter->pChannelMapOut, pConverter->channelsOut, iChannelOut);

                                if (ma_is_spatial_channel_position(channelPosOut)) {
                                    float weight = 0;
                                    if (pConverter->mixingMode == ma_channel_mix_mode_rectangular) {
                                        weight = ma_calculate_channel_position_rectangular_weight(channelPosIn, channelPosOut);
                                    }

                                    /* Only apply the weight if we haven't already got some contribution from the respective channels. */
                                    if (pConverter->format == ma_format_f32) {
                                        if (pConverter->weights.f32[iChannelIn][iChannelOut] == 0) {
                                            pConverter->weights.f32[iChannelIn][iChannelOut] = weight;
                                        }
                                    } else {
                                        if (pConverter->weights.s16[iChannelIn][iChannelOut] == 0) {
                                            pConverter->weights.s16[iChannelIn][iChannelOut] = ma_channel_converter_float_to_fixed(weight);
                                        }
                                    }
                                }
                            }
                        }
                    }
                }

                /* Unmapped output channels. */
                for (iChannelOut = 0; iChannelOut < pConverter->channelsOut; ++iChannelOut) {
                    ma_channel channelPosOut = ma_channel_map_get_channel(pConverter->pChannelMapOut, pConverter->channelsOut, iChannelOut);

                    if (ma_is_spatial_channel_position(channelPosOut)) {
                        if (!ma_channel_map_contains_channel_position(pConverter->channelsIn, pConverter->pChannelMapIn, channelPosOut)) {
                            for (iChannelIn = 0; iChannelIn < pConverter->channelsIn; ++iChannelIn) {
                                ma_channel channelPosIn = ma_channel_map_get_channel(pConverter->pChannelMapIn, pConverter->channelsIn, iChannelIn);

                                if (ma_is_spatial_channel_position(channelPosIn)) {
                                    float weight = 0;
                                    if (pConverter->mixingMode == ma_channel_mix_mode_rectangular) {
                                        weight = ma_calculate_channel_position_rectangular_weight(channelPosIn, channelPosOut);
                                    }

                                    /* Only apply the weight if we haven't already got some contribution from the respective channels. */
                                    if (pConverter->format == ma_format_f32) {
                                        if (pConverter->weights.f32[iChannelIn][iChannelOut] == 0) {
                                            pConverter->weights.f32[iChannelIn][iChannelOut] = weight;
                                        }
                                    } else {
                                        if (pConverter->weights.s16[iChannelIn][iChannelOut] == 0) {
                                            pConverter->weights.s16[iChannelIn][iChannelOut] = ma_channel_converter_float_to_fixed(weight);
                                        }
                                    }
                                }
                            }
                        }
                    }
                }

                /* If LFE is in the output channel map but was not present in the input channel map, configure its weight now */
                if (pConfig->calculateLFEFromSpatialChannels) {
                    if (!ma_channel_map_contains_channel_position(pConverter->channelsIn, pConverter->pChannelMapIn, MA_CHANNEL_LFE)) {
                        ma_uint32 spatialChannelCount = ma_channel_map_get_spatial_channel_count(pConverter->pChannelMapIn, pConverter->channelsIn);
                        ma_uint32 iChannelOutLFE;

                        if (spatialChannelCount > 0 && ma_channel_map_find_channel_position(pConverter->channelsOut, pConverter->pChannelMapOut, MA_CHANNEL_LFE, &iChannelOutLFE)) {
                            const float weightForLFE = 1.0f / spatialChannelCount;
                            for (iChannelIn = 0; iChannelIn < pConverter->channelsIn; ++iChannelIn) {
                                const ma_channel channelPosIn = ma_channel_map_get_channel(pConverter->pChannelMapIn, pConverter->channelsIn, iChannelIn);
                                if (ma_is_spatial_channel_position(channelPosIn)) {
                                    if (pConverter->format == ma_format_f32) {
                                        if (pConverter->weights.f32[iChannelIn][iChannelOutLFE] == 0) {
                                            pConverter->weights.f32[iChannelIn][iChannelOutLFE] = weightForLFE;
                                        }
                                    } else {
                                        if (pConverter->weights.s16[iChannelIn][iChannelOutLFE] == 0) {
                                            pConverter->weights.s16[iChannelIn][iChannelOutLFE] = ma_channel_converter_float_to_fixed(weightForLFE);
                                        }
                                    }
                                }
                            }
                        }
                    }
                }
            } break;
        }
    }

    return MA_SUCCESS;
}